

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

TValue * luaH_getint(Table *t,lua_Integer key)

{
  uint uVar1;
  Node *pNStack_28;
  int nx;
  Node *n;
  lua_Integer key_local;
  Table *t_local;
  
  if (key - 1U < (ulong)t->alimit) {
    return t->array + key + -1;
  }
  if ((((t->flags & 0x80) == 0) || ((t->alimit & t->alimit - 1) == 0)) ||
     ((key != (ulong)(t->alimit + 1) && (uVar1 = luaH_realasize(t), (ulong)uVar1 <= key - 1U)))) {
    pNStack_28 = hashint(t,key);
    while( true ) {
      if (((pNStack_28->u).key_tt == '\x03') && ((pNStack_28->u).key_val.gc == (GCObject *)key)) {
        return (TValue *)pNStack_28;
      }
      if ((pNStack_28->u).next == 0) break;
      pNStack_28 = pNStack_28 + (pNStack_28->u).next;
    }
    t_local = (Table *)&absentkey;
  }
  else {
    t->alimit = (uint)key;
    t_local = (Table *)(t->array + key + -1);
  }
  return (TValue *)t_local;
}

Assistant:

const TValue *luaH_getint (Table *t, lua_Integer key) {
  if (l_castS2U(key) - 1u < t->alimit)  /* 'key' in [1, t->alimit]? */
    return &t->array[key - 1];
  else if (!limitequalsasize(t) &&  /* key still may be in the array part? */
           (l_castS2U(key) == t->alimit + 1 ||
            l_castS2U(key) - 1u < luaH_realasize(t))) {
    t->alimit = cast_uint(key);  /* probably '#t' is here now */
    return &t->array[key - 1];
  }
  else {
    Node *n = hashint(t, key);
    for (;;) {  /* check whether 'key' is somewhere in the chain */
      if (keyisinteger(n) && keyival(n) == key)
        return gval(n);  /* that's it */
      else {
        int nx = gnext(n);
        if (nx == 0) break;
        n += nx;
      }
    }
    return &absentkey;
  }
}